

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fake_ntlm.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  size_t sVar7;
  FILE *pFVar8;
  char **ppcVar9;
  uint *puVar10;
  char *pcVar11;
  size_t sVar12;
  char *pcVar13;
  ulong uVar14;
  size_t __size;
  long lStack_490;
  ulong local_488;
  size_t size;
  char *local_478;
  char *local_470;
  char *local_468;
  char *type1_output;
  char *type3_input;
  char *type1_input;
  char *type3_output;
  char *endptr;
  char buf [1024];
  
  type1_input = (char *)0x0;
  type3_input = (char *)0x0;
  type1_output = (char *)0x0;
  type3_output = (char *)0x0;
  size = 0;
  buf[0] = '\0';
  bVar2 = false;
  local_468 = "unknown";
  local_470 = "unknown";
  local_478 = "unknown";
  iVar4 = 1;
  while (iVar3 = iVar4, iVar3 < argc) {
    pcVar13 = argv[iVar3];
    iVar4 = strcmp("--use-cached-creds",pcVar13);
    if (iVar4 == 0) {
      bVar2 = true;
      iVar4 = iVar3 + 1;
    }
    else {
      iVar4 = strcmp("--helper-protocol",pcVar13);
      if (iVar4 == 0) {
        iVar4 = iVar3 + 1;
        if (iVar4 < argc) {
          local_468 = argv[iVar4];
          iVar4 = iVar3 + 2;
        }
      }
      else {
        iVar4 = strcmp("--username",pcVar13);
        if (iVar4 == 0) {
          iVar4 = iVar3 + 1;
          if (iVar4 < argc) {
            local_470 = argv[iVar4];
            iVar4 = iVar3 + 2;
          }
        }
        else {
          iVar4 = strcmp("--domain",pcVar13);
          if (iVar4 != 0) {
            puts(
                "Usage: fake_ntlm [option]\n --use-cached-creds\n --helper-protocol [protocol]\n --username [username]\n --domain [domain]"
                );
            goto LAB_00104dec;
          }
          iVar4 = iVar3 + 1;
          if (iVar4 < argc) {
            local_478 = argv[iVar4];
            iVar4 = iVar3 + 2;
          }
        }
      }
    }
  }
  pcVar13 = "no";
  if (bVar2) {
    pcVar13 = "yes";
  }
  logmsg("fake_ntlm (user: %s) (proto: %s) (domain: %s) (cached creds: %s)",local_470,local_468,
         local_478,pcVar13);
  pcVar13 = getenv("CURL_NTLM_AUTH_TESTNUM");
  if (pcVar13 == (char *)0x0) {
    pcVar13 = "Test number not specified in CURL_NTLM_AUTH_TESTNUM";
  }
  else {
    pcVar6 = (char *)strtol(pcVar13,&endptr,10);
    sVar7 = strlen(pcVar13);
    if ((endptr == pcVar13 + sVar7) && (0 < (long)pcVar6)) {
      pcVar13 = getenv("CURL_NTLM_AUTH_SRCDIR");
      if (pcVar13 != (char *)0x0) {
        path = pcVar13;
      }
      pcVar13 = test2file((long)pcVar6);
      pFVar8 = fopen64(pcVar13,"rb");
      if (pFVar8 == (FILE *)0x0) {
LAB_00104ea9:
        puVar10 = (uint *)__errno_location();
        uVar5 = *puVar10;
        pcVar11 = strerror(uVar5);
        logmsg("fopen() failed with error: %d %s",(ulong)uVar5,pcVar11);
        logmsg("Error opening file: %s",pcVar13);
        pcVar13 = "Couldn\'t open test file %ld";
LAB_00104de5:
        logmsg(pcVar13,pcVar6);
      }
      else {
        uVar5 = getpart(&type1_input,&size,"ntlm_auth_type1","input",(FILE *)pFVar8);
        fclose(pFVar8);
        if ((uVar5 == 0) && (size != 0)) {
          pFVar8 = fopen64(pcVar13,"rb");
          if (pFVar8 == (FILE *)0x0) goto LAB_00104ea9;
          size = 0;
          local_478 = pcVar6;
          uVar5 = getpart(&type3_input,&size,"ntlm_auth_type3","input",(FILE *)pFVar8);
          fclose(pFVar8);
          if ((uVar5 == 0) && (size != 0)) {
            do {
              pcVar6 = fgets(buf,0x400,_stdin);
              if (pcVar6 == (char *)0x0) {
                return 1;
              }
              iVar4 = strcmp(buf,type1_input);
              pcVar6 = type3_input;
              if (iVar4 == 0) {
                pFVar8 = fopen64(pcVar13,"rb");
                if (pFVar8 == (FILE *)0x0) {
LAB_00104d18:
                  puVar10 = (uint *)__errno_location();
                  uVar5 = *puVar10;
                  pcVar6 = strerror(uVar5);
                  logmsg("fopen() failed with error: %d %s",(ulong)uVar5,pcVar6);
                  logmsg("Error opening file: %s",pcVar13);
                  pcVar13 = "Couldn\'t open test file %ld";
                  pcVar6 = local_478;
                  goto LAB_00104de5;
                }
                size = 0;
                uVar5 = getpart(&type1_output,&size,"ntlm_auth_type1","output",(FILE *)pFVar8);
                fclose(pFVar8);
                if ((uVar5 != 0) || (ppcVar9 = &type1_output, size == 0)) {
                  pcVar13 = "getpart() type 1 output failed with error: %d";
                  goto LAB_00104da8;
                }
              }
              else {
                sVar7 = strlen(type3_input);
                iVar4 = strncmp(buf,pcVar6,sVar7);
                if (iVar4 != 0) {
                  local_488 = 0;
                  curl_mprintf("Unknown request\n");
                  sVar7 = strlen(buf);
                  if (sVar7 == 0) {
                    __size = 10;
                  }
                  else {
                    local_488 = 7;
                    if (7 < sVar7 >> 1) {
                      local_488 = sVar7 >> 1;
                    }
                    __size = local_488 + sVar7;
                  }
                  pcVar13 = (char *)malloc(__size);
                  if (pcVar13 == (char *)0x0) goto LAB_00104dd9;
                  if (sVar7 == 0) {
                    curl_msnprintf(pcVar13,__size,"%s","[NOTHING]");
                    goto LAB_00104e8b;
                  }
                  sVar12 = 0;
                  uVar14 = 0;
                  goto LAB_00104e1e;
                }
                pFVar8 = fopen64(pcVar13,"rb");
                if (pFVar8 == (FILE *)0x0) goto LAB_00104d18;
                size = 0;
                uVar5 = getpart(&type3_output,&size,"ntlm_auth_type3","output",(FILE *)pFVar8);
                fclose(pFVar8);
                if ((uVar5 != 0) || (ppcVar9 = &type3_output, size == 0)) {
                  pcVar13 = "getpart() type 3 output failed with error: %d";
                  goto LAB_00104da8;
                }
              }
              curl_mprintf("%s",*ppcVar9);
              fflush(_stdout);
            } while( true );
          }
          pcVar13 = "getpart() type 3 input failed with error: %d";
        }
        else {
          pcVar13 = "getpart() type 1 input failed with error: %d";
        }
LAB_00104da8:
        logmsg(pcVar13,(ulong)uVar5);
      }
      goto LAB_00104dec;
    }
    pcVar13 = "Test number not valid in CURL_NTLM_AUTH_TESTNUM";
  }
  logmsg(pcVar13);
LAB_00104dec:
  exit(1);
LAB_00104e1e:
  if (sVar7 != sVar12) {
    pcVar6 = pcVar13;
    if (uVar14 <= __size - 7) goto LAB_00104e4b;
    __size = __size + local_488;
    pcVar6 = (char *)realloc(pcVar13,__size);
    if (pcVar6 != (char *)0x0) goto LAB_00104e4b;
    free(pcVar13);
LAB_00104dd9:
    pcVar13 = "OOM formatting invalid input: \'%s\'\n";
    pcVar6 = buf;
    goto LAB_00104de5;
  }
  goto LAB_00104e86;
LAB_00104e4b:
  cVar1 = buf[sVar12];
  if ((byte)(cVar1 + 0x81U) < 0xa2) {
    curl_msnprintf(pcVar6 + uVar14,__size - uVar14,"[0x%02X]",(ulong)(uint)(int)cVar1);
    lStack_490 = 6;
  }
  else {
    pcVar6[uVar14] = cVar1;
    lStack_490 = 1;
  }
  uVar14 = uVar14 + lStack_490;
  sVar12 = sVar12 + 1;
  pcVar13 = pcVar6;
  goto LAB_00104e1e;
LAB_00104e86:
  pcVar13[uVar14] = '\0';
LAB_00104e8b:
  logmsg("invalid input: \'%s\'\n",pcVar13);
  free(pcVar13);
  goto LAB_00104dec;
}

Assistant:

int main(int argc, char *argv[])
{
  char buf[1024];
  FILE *stream;
  char *filename;
  int error;
  char *type1_input = NULL, *type3_input = NULL;
  char *type1_output = NULL, *type3_output = NULL;
  size_t size = 0;
  long testnum;
  const char *env;
  int arg = 1;
  char *helper_user = (char *)"unknown";
  char *helper_proto = (char *)"unknown";
  char *helper_domain = (char *)"unknown";
  bool use_cached_creds = FALSE;
  char *msgbuf;

  buf[0] = '\0';

  while(argc > arg) {
    if(!strcmp("--use-cached-creds", argv[arg])) {
      use_cached_creds = TRUE;
      arg++;
    }
    else if(!strcmp("--helper-protocol", argv[arg])) {
      arg++;
      if(argc > arg)
        helper_proto = argv[arg++];
    }
    else if(!strcmp("--username", argv[arg])) {
      arg++;
      if(argc > arg)
        helper_user = argv[arg++];
    }
    else if(!strcmp("--domain", argv[arg])) {
      arg++;
      if(argc > arg)
        helper_domain = argv[arg++];
    }
    else {
      puts("Usage: fake_ntlm [option]\n"
           " --use-cached-creds\n"
           " --helper-protocol [protocol]\n"
           " --username [username]\n"
           " --domain [domain]");
      exit(1);
    }
  }

  logmsg("fake_ntlm (user: %s) (proto: %s) (domain: %s) (cached creds: %s)",
         helper_user, helper_proto, helper_domain,
         (use_cached_creds) ? "yes" : "no");

  env = getenv("CURL_NTLM_AUTH_TESTNUM");
  if(env) {
    char *endptr;
    long lnum = strtol(env, &endptr, 10);
    if((endptr != env + strlen(env)) || (lnum < 1L)) {
      logmsg("Test number not valid in CURL_NTLM_AUTH_TESTNUM");
      exit(1);
    }
    testnum = lnum;
  }
  else {
    logmsg("Test number not specified in CURL_NTLM_AUTH_TESTNUM");
    exit(1);
  }

  env = getenv("CURL_NTLM_AUTH_SRCDIR");
  if(env) {
    path = env;
  }

  filename = test2file(testnum);
  stream=fopen(filename, "rb");
  if(!stream) {
    error = errno;
    logmsg("fopen() failed with error: %d %s", error, strerror(error));
    logmsg("Error opening file: %s", filename);
    logmsg("Couldn't open test file %ld", testnum);
    exit(1);
  }
  else {
    /* get the ntlm_auth input/output */
    error = getpart(&type1_input, &size, "ntlm_auth_type1", "input", stream);
    fclose(stream);
    if(error || size == 0) {
      logmsg("getpart() type 1 input failed with error: %d", error);
      exit(1);
    }
  }

  stream=fopen(filename, "rb");
  if(!stream) {
    error = errno;
    logmsg("fopen() failed with error: %d %s", error, strerror(error));
    logmsg("Error opening file: %s", filename);
    logmsg("Couldn't open test file %ld", testnum);
    exit(1);
  }
  else {
    size = 0;
    error = getpart(&type3_input, &size, "ntlm_auth_type3", "input", stream);
    fclose(stream);
    if(error || size == 0) {
      logmsg("getpart() type 3 input failed with error: %d", error);
      exit(1);
    }
  }

  while(fgets(buf, sizeof(buf), stdin)) {
    if(strcmp(buf, type1_input) == 0) {
      stream=fopen(filename, "rb");
      if(!stream) {
        error = errno;
        logmsg("fopen() failed with error: %d %s", error, strerror(error));
        logmsg("Error opening file: %s", filename);
        logmsg("Couldn't open test file %ld", testnum);
        exit(1);
      }
      else {
        size = 0;
        error = getpart(&type1_output, &size, "ntlm_auth_type1", "output",
                        stream);
        fclose(stream);
        if(error || size == 0) {
          logmsg("getpart() type 1 output failed with error: %d", error);
          exit(1);
        }
      }
      printf("%s", type1_output);
      fflush(stdout);
    }
    else if(strncmp(buf, type3_input, strlen(type3_input)) == 0) {
      stream=fopen(filename, "rb");
      if(!stream) {
        error = errno;
        logmsg("fopen() failed with error: %d %s", error, strerror(error));
        logmsg("Error opening file: %s", filename);
        logmsg("Couldn't open test file %ld", testnum);
        exit(1);
      }
      else {
        size = 0;
        error = getpart(&type3_output, &size, "ntlm_auth_type3", "output",
                        stream);
        fclose(stream);
        if(error || size == 0) {
          logmsg("getpart() type 3 output failed with error: %d", error);
          exit(1);
        }
      }
      printf("%s", type3_output);
      fflush(stdout);
    }
    else {
      printf("Unknown request\n");
      msgbuf = printable(buf, 0);
      if(msgbuf) {
        logmsg("invalid input: '%s'\n", msgbuf);
        free(msgbuf);
      }
      else
        logmsg("OOM formatting invalid input: '%s'\n", buf);
      exit(1);
    }
  }
  return 1;
}